

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O0

void __thiscall soplex::SVectorBase<double>::add(SVectorBase<double> *this,int n,int *i,double *v)

{
  int iVar1;
  double *in_RCX;
  int *in_RDX;
  int in_ESI;
  SVectorBase<double> *in_RDI;
  Nonzero<double> *e;
  int newnnz;
  Nonzero<double> *local_30;
  int local_24;
  double *local_20;
  int *local_18;
  int local_c;
  
  if (0 < in_ESI) {
    local_24 = 0;
    local_30 = in_RDI->m_elem;
    iVar1 = size(in_RDI);
    local_30 = local_30 + iVar1;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_c = in_ESI;
    while (local_c != 0) {
      if ((*local_20 != 0.0) || (NAN(*local_20))) {
        local_30->idx = *local_18;
        local_30->val = *local_20;
        local_30 = local_30 + 1;
        local_24 = local_24 + 1;
      }
      local_18 = local_18 + 1;
      local_20 = local_20 + 1;
      local_c = local_c + -1;
    }
    iVar1 = size(in_RDI);
    set_size(in_RDI,iVar1 + local_24);
  }
  return;
}

Assistant:

void add(int n, const int i[], const R v[])
   {
      assert(n + size() <= max());

      if(n <= 0)
         return;

      int newnnz = 0;

      Nonzero<R>* e = m_elem + size();

      while(n--)
      {
         if(*v != 0.0)
         {
            assert(e != nullptr);
            e->idx = *i;
            e->val = *v;
            e++;
            ++newnnz;
         }

         i++;
         v++;
      }

      set_size(size() + newnnz);
   }